

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O2

Real amrex::RandomNormal(Real mean,Real stddev)

{
  result_type_conflict rVar1;
  normal_distribution<double> distribution;
  normal_distribution<double> local_20;
  
  local_20._M_saved = 0.0;
  local_20._M_saved_available = false;
  local_20._M_param._M_mean = mean;
  local_20._M_param._M_stddev = stddev;
  rVar1 = std::normal_distribution<double>::operator()
                    (&local_20,::(anonymous_namespace)::generators);
  return rVar1;
}

Assistant:

amrex::Real amrex::RandomNormal (amrex::Real mean, amrex::Real stddev)
{
    std::normal_distribution<amrex::Real> distribution(mean, stddev);
    int tid = OpenMP::get_thread_num();
    return distribution(generators[tid]);
}